

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O2

int speex_resampler_process_int
              (SpeexResamplerState *st,uint channel_index,short *in,uint *in_len,short *out,
              uint *out_len)

{
  float fVar1;
  int iVar2;
  spx_word16_t *psVar3;
  short sVar4;
  int iVar5;
  short *psVar6;
  int iVar7;
  uint uVar8;
  short *psVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  double dVar14;
  uint ichunk;
  uint local_109c;
  uint local_1098;
  uint local_1094;
  short *local_1090;
  uint local_1084;
  uint local_1080;
  uint local_107c;
  long local_1078;
  short *local_1070;
  spx_word16_t *y;
  uint *local_1060;
  uint *local_1058;
  long local_1050;
  ulong local_1048;
  long local_1040;
  spx_word16_t ystack [1024];
  
  local_1040 = (long)st->in_stride;
  iVar2 = st->out_stride;
  local_107c = *in_len;
  uVar8 = *out_len;
  uVar10 = st->mem_alloc_size * channel_index;
  psVar3 = st->mem;
  local_1084 = (st->mem_alloc_size - st->filt_len) + 1;
  st->out_stride = 1;
  local_1048 = (ulong)channel_index;
  local_1050 = local_1040 * 2;
  local_1070 = in;
  local_1098 = channel_index;
  local_1078 = (long)iVar2;
  local_1060 = in_len;
  local_1058 = out_len;
  do {
    uVar11 = local_1048;
    if ((local_107c == 0) || (uVar8 == 0)) {
      st->out_stride = (int)local_1078;
      *local_1060 = *local_1060 - local_107c;
      *local_1058 = *local_1058 - uVar8;
      return (int)(st->resampler_ptr == resampler_basic_zero);
    }
    y = ystack;
    ichunk = local_1084;
    if (local_107c < local_1084) {
      ichunk = local_107c;
    }
    local_109c = 0x400;
    if (uVar8 < 0x400) {
      local_109c = uVar8;
    }
    local_1090 = out;
    if (st->magic_samples[local_1048] == 0) {
      iVar5 = 0;
      local_1094 = uVar8;
LAB_00129d0d:
      psVar9 = local_1090;
      uVar11 = (ulong)ichunk;
      if (local_1070 == (short *)0x0) {
        for (iVar7 = -1; iVar7 - ichunk != -1; iVar7 = iVar7 + 1) {
          psVar3[(ulong)uVar10 + (ulong)(st->filt_len + iVar7)] = 0.0;
        }
      }
      else {
        iVar7 = -1;
        psVar6 = local_1070;
        while (bVar13 = uVar11 != 0, uVar11 = uVar11 - 1, bVar13) {
          psVar3[(ulong)uVar10 + (ulong)(st->filt_len + iVar7)] = (float)(int)*psVar6;
          iVar7 = iVar7 + 1;
          psVar6 = (short *)((long)psVar6 + local_1050);
        }
      }
      speex_resampler_process_native(st,local_1098,&ichunk,y,&local_109c);
      local_1080 = local_109c;
    }
    else {
      iVar5 = speex_resampler_magic(st,local_1098,&y,local_109c);
      local_109c = local_109c - iVar5;
      local_1094 = uVar8 - iVar5;
      if (st->magic_samples[uVar11] == 0) goto LAB_00129d0d;
      ichunk = 0;
      psVar9 = local_1090;
      local_1080 = 0;
    }
    uVar12 = iVar5 + local_1080;
    for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
      fVar1 = ystack[uVar11];
      sVar4 = -0x8000;
      if ((-32767.5 <= fVar1) && (sVar4 = 0x7fff, fVar1 <= 32766.5)) {
        dVar14 = floor((double)fVar1 + 0.5);
        sVar4 = (short)(int)dVar14;
      }
      *psVar9 = sVar4;
      psVar9 = psVar9 + iVar2;
    }
    local_107c = local_107c - ichunk;
    uVar8 = local_1094 - local_1080;
    out = local_1090 + uVar12 * (int)local_1078;
    local_1070 = local_1070;
    if (local_1070 != (short *)0x0) {
      local_1070 = local_1070 + ichunk * (int)local_1040;
    }
  } while( true );
}

Assistant:

EXPORT int speex_resampler_process_int(SpeexResamplerState *st, spx_uint32_t channel_index, const spx_int16_t *in, spx_uint32_t *in_len, spx_int16_t *out, spx_uint32_t *out_len)
#else
EXPORT int speex_resampler_process_float(SpeexResamplerState *st, spx_uint32_t channel_index, const float *in, spx_uint32_t *in_len, float *out, spx_uint32_t *out_len)
#endif
{
   int j;
   spx_uint32_t ilen = *in_len;
   spx_uint32_t olen = *out_len;
   spx_word16_t *x = st->mem + channel_index * st->mem_alloc_size;
   const int filt_offs = st->filt_len - 1;
   const spx_uint32_t xlen = st->mem_alloc_size - filt_offs;
   const int istride = st->in_stride;

   if (st->magic_samples[channel_index])
      olen -= speex_resampler_magic(st, channel_index, &out, olen);
   if (! st->magic_samples[channel_index]) {
      while (ilen && olen) {
        spx_uint32_t ichunk = (ilen > xlen) ? xlen : ilen;
        spx_uint32_t ochunk = olen;

        if (in) {
           for(j=0;j<ichunk;++j)
              x[j+filt_offs]=in[j*istride];
        } else {
          for(j=0;j<ichunk;++j)
            x[j+filt_offs]=0;
        }
        speex_resampler_process_native(st, channel_index, &ichunk, out, &ochunk);
        ilen -= ichunk;
        olen -= ochunk;
        out += ochunk * st->out_stride;
        if (in)
           in += ichunk * istride;
      }
   }
   *in_len -= ilen;
   *out_len -= olen;
   return st->resampler_ptr == resampler_basic_zero ? RESAMPLER_ERR_ALLOC_FAILED : RESAMPLER_ERR_SUCCESS;
}